

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O2

void Service_Republish(UA_Server *server,UA_Session *session,UA_RepublishRequest *request,
                      UA_RepublishResponse *response)

{
  UA_StatusCode UVar1;
  UA_Subscription *pUVar2;
  UA_NotificationMessageEntry *pUVar3;
  
  pUVar2 = UA_Session_getSubscriptionByID(session,request->subscriptionId);
  if (pUVar2 == (UA_Subscription *)0x0) {
    UVar1 = 0x80280000;
  }
  else {
    pUVar2->currentLifetimeCount = 0;
    pUVar3 = (UA_NotificationMessageEntry *)&pUVar2->retransmissionQueue;
    do {
      pUVar3 = (pUVar3->listEntry).tqe_next;
      if (pUVar3 == (UA_NotificationMessageEntry *)0x0) {
        UVar1 = 0x807b0000;
        goto LAB_001223e6;
      }
    } while ((pUVar3->message).sequenceNumber != request->retransmitSequenceNumber);
    UVar1 = UA_copy(&pUVar3->message,&response->notificationMessage,UA_TYPES + 0x22);
  }
LAB_001223e6:
  (response->responseHeader).serviceResult = UVar1;
  return;
}

Assistant:

void Service_Republish(UA_Server *server, UA_Session *session, const UA_RepublishRequest *request,
                       UA_RepublishResponse *response) {
    UA_LOG_DEBUG_SESSION(server->config.logger, session, "Processing RepublishRequest");
    /* get the subscription */
    UA_Subscription *sub = UA_Session_getSubscriptionByID(session, request->subscriptionId);
    if (!sub) {
        response->responseHeader.serviceResult = UA_STATUSCODE_BADSUBSCRIPTIONIDINVALID;
        return;
    }

    /* Reset the subscription lifetime */
    sub->currentLifetimeCount = 0;

    /* Find the notification in the retransmission queue  */
    UA_NotificationMessageEntry *entry;
    TAILQ_FOREACH(entry, &sub->retransmissionQueue, listEntry) {
        if(entry->message.sequenceNumber == request->retransmitSequenceNumber)
            break;
    }
    if(entry)
        response->responseHeader.serviceResult =
            UA_NotificationMessage_copy(&entry->message, &response->notificationMessage);
    else
      response->responseHeader.serviceResult = UA_STATUSCODE_BADMESSAGENOTAVAILABLE;
}